

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_extension.c
# Opt level: O2

dlep_parser_error
dlep_extension_router_process_destination(dlep_extension *ext,dlep_session *session)

{
  int iVar1;
  oonf_layer2_neigh *poVar2;
  dlep_parser_error dVar3;
  
  dVar3 = DLEP_NEW_PARSER_OKAY;
  if (session->restrict_signal == DLEP_ALL_SIGNALS) {
    poVar2 = dlep_extension_get_l2_neighbor(session);
    if (poVar2 != (oonf_layer2_neigh *)0x0) {
      iVar1 = dlep_reader_map_l2neigh_data(poVar2->data,session,ext);
      dVar3 = DLEP_NEW_PARSER_OKAY;
      if (iVar1 != 0) {
        dVar3 = DLEP_NEW_PARSER_UNSUPPORTED_TLV;
        if (((&log_global_mask)[session->log_source] & 2) != 0) {
          oonf_log(2,(ulong)session->log_source,"src/generic/dlep/dlep_extension.c",0x103,0,0,
                   "tlv mapping for extension %d failed: %d",ext->id,iVar1);
        }
      }
    }
  }
  return dVar3;
}

Assistant:

enum dlep_parser_error
dlep_extension_router_process_destination(struct dlep_extension *ext, struct dlep_session *session) {
  struct oonf_layer2_neigh *l2neigh;
  enum dlep_parser_error result;

  if (session->restrict_signal != DLEP_ALL_SIGNALS) {
    /* ignore unless we have an established session */
    return DLEP_NEW_PARSER_OKAY;
  }

  l2neigh = dlep_extension_get_l2_neighbor(session);
  if (!l2neigh) {
    return DLEP_NEW_PARSER_OKAY;
  }

  result = dlep_reader_map_l2neigh_data(l2neigh->data, session, ext);
  if (result) {
    OONF_INFO(session->log_source, "tlv mapping for extension %d failed: %d", ext->id, result);
    return DLEP_NEW_PARSER_UNSUPPORTED_TLV;
  }
  return DLEP_NEW_PARSER_OKAY;
}